

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

parasail_result_t * parasail_result_new(void)

{
  parasail_result_t *ppVar1;
  
  ppVar1 = (parasail_result_t *)calloc(1,0x18);
  if (ppVar1 == (parasail_result_t *)0x0) {
    fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new",0x18);
  }
  return ppVar1;
}

Assistant:

parasail_result_t* parasail_result_new()
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    PARASAIL_NEW(result, parasail_result_t);

    result->score = 0;
    result->end_query = 0;
    result->end_ref = 0;
    result->flag = 0;
    result->extra = NULL;

    return result;
}